

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

char * uvTypeName(VType t)

{
  char *pcStack_10;
  VType t_local;
  
  switch(t) {
  case VNULL:
    pcStack_10 = "null";
    break;
  case VOBJ:
    pcStack_10 = "object";
    break;
  case VARR:
    pcStack_10 = "array";
    break;
  case VSTR:
    pcStack_10 = "string";
    break;
  case VNUM:
    pcStack_10 = "number";
    break;
  case VBOOL:
    pcStack_10 = "bool";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *uvTypeName(UniValue::VType t)
{
    switch (t) {
    case UniValue::VNULL: return "null";
    case UniValue::VBOOL: return "bool";
    case UniValue::VOBJ: return "object";
    case UniValue::VARR: return "array";
    case UniValue::VSTR: return "string";
    case UniValue::VNUM: return "number";
    }

    // not reached
    return NULL;
}